

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCC.h
# Opt level: O3

void __thiscall dg::SCC<dg::pta::PSNode>::_compute(SCC<dg::pta::PSNode> *this,PSNode *n)

{
  CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U> *this_00;
  iterator *piVar1;
  pointer ppPVar2;
  pointer pvVar3;
  pointer pvVar4;
  PSNode *pPVar5;
  uint uVar6;
  NodeInfo *pNVar7;
  NodeInfo *pNVar8;
  _Elt_pointer ppPVar9;
  uint uVar10;
  pointer ppPVar11;
  PSNode *w;
  PSNode *succ;
  PSNode *local_60;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_58;
  PSNode *local_40;
  vector<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,std::allocator<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>>
  *local_38;
  
  this_00 = &this->_info;
  local_40 = n;
  pNVar7 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                     (this_00,&local_40);
  uVar6 = this->index + 1;
  this->index = uVar6;
  pNVar7->lowpt = uVar6;
  pNVar7->dfs_id = uVar6;
  pNVar7->on_stack = true;
  ppPVar9 = (this->stack).Container.c.
            super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppPVar9 ==
      *(_Elt_pointer *)
       ((long)&(this->stack).Container.c.
               super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
               super__Deque_impl_data._M_finish + 0x10) + -1) {
    std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
    _M_push_back_aux<dg::pta::PSNode*const&>
              ((deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)this,&local_40);
  }
  else {
    *ppPVar9 = local_40;
    piVar1 = &(this->stack).Container.c.
              super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  ppPVar2 = (local_40->super_SubgraphNode<dg::pta::PSNode>)._successors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar11 = (local_40->super_SubgraphNode<dg::pta::PSNode>)._successors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppPVar11 != ppPVar2; ppPVar11 = ppPVar11 + 1) {
    local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*ppPVar11;
    pNVar8 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                       (this_00,(PSNode **)&local_58);
    uVar6 = pNVar8->dfs_id;
    if (uVar6 == 0) {
      _compute(this,(PSNode *)
                    local_58.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
      uVar6 = pNVar8->lowpt;
LAB_0010d907:
      uVar10 = pNVar7->lowpt;
      if (uVar6 < pNVar7->lowpt) {
        uVar10 = uVar6;
      }
      pNVar7->lowpt = uVar10;
    }
    else if (pNVar8->on_stack == true) goto LAB_0010d907;
  }
  if (pNVar7->lowpt == pNVar7->dfs_id) {
    local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (PSNode **)0x0;
    local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (PSNode **)0x0;
    local_38 = (vector<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,std::allocator<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>>
                *)&this->scc;
    pvVar3 = (this->scc).
             super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar4 = (this->scc).
             super__Vector_base<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppPVar9 = (this->stack).Container.c.
              super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    do {
      if (ppPVar9 ==
          *(_Elt_pointer *)
           ((long)&(this->stack).Container.c.
                   super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                   super__Deque_impl_data._M_finish + 8)) {
        ppPVar9 = (*(_Map_pointer *)
                    ((long)&(this->stack).Container.c.
                            super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
      }
      pNVar8 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                         (this_00,ppPVar9 + -1);
      if (pNVar8->dfs_id < pNVar7->dfs_id) break;
      ppPVar9 = (this->stack).Container.c.
                super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (ppPVar9 ==
          *(_Elt_pointer *)
           ((long)&(this->stack).Container.c.
                   super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                   super__Deque_impl_data._M_finish + 8)) {
        ppPVar9 = (*(_Map_pointer *)
                    ((long)&(this->stack).Container.c.
                            super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
      }
      pPVar5 = ppPVar9[-1];
      std::deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::pop_back
                ((deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)this);
      local_60 = pPVar5;
      pNVar8 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                         (this_00,&local_60);
      pNVar8->on_stack = false;
      if (local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
        _M_realloc_insert<dg::pta::PSNode*const&>
                  ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        *local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_60;
        local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      (local_60->super_SubgraphNode<dg::pta::PSNode>).scc_id =
           (int)((ulong)((long)pvVar3 - (long)pvVar4) >> 3) * -0x55555555;
      ppPVar9 = (this->stack).Container.c.
                super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
    } while (ppPVar9 !=
             (this->stack).Container.c.
             super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
    std::
    vector<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,std::allocator<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>>
    ::emplace_back<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
              (local_38,&local_58);
    if (local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void _compute(NodeT *n) {
        auto &info = _info[n];
        // here we using the fact that we are a friend class
        // of SubgraphNode. If we would need to make this
        // algorithm more generinc, we add setters/getters.
        info.dfs_id = info.lowpt = ++index;
        info.on_stack = true;
        stack.push(n);

        for (auto *succ : n->successors()) {
            auto &succ_info = _info[succ];
            if (succ_info.dfs_id == 0) {
                assert(!succ_info.on_stack);
                _compute(succ);
                info.lowpt = std::min(info.lowpt, succ_info.lowpt);
            } else if (succ_info.on_stack) {
                info.lowpt = std::min(info.lowpt, succ_info.dfs_id);
            }
        }

        if (info.lowpt == info.dfs_id) {
            SCC_component_t component;
            size_t component_num = scc.size();

            NodeT *w;
            while (_info[stack.top()].dfs_id >= info.dfs_id) {
                w = stack.pop();
                auto &winfo = _info[w];
                assert(winfo.on_stack == true);
                winfo.on_stack = false;
                component.push_back(w);
                // the numbers scc_id give
                // a reverse topological order
                w->setSCCId(component_num);

                if (stack.empty())
                    break;
            }

            scc.push_back(std::move(component));
        }
    }